

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O1

int descend(saucy *s,coloring *c,int target,int min)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  Vec_Int_t *p;
  int *piVar4;
  Vec_Int_t *p_00;
  size_t sVar5;
  long lVar6;
  long lVar7;
  size_t __nmemb;
  uint uVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  
  lVar6 = (long)c->clen[target] + (long)target;
  piVar4 = &s->stats->nodes;
  *piVar4 = *piVar4 + 1;
  piVar4 = c->lab;
  iVar3 = piVar4[min];
  iVar10 = piVar4[lVar6];
  piVar4[min] = iVar10;
  piVar2 = c->unlab;
  piVar2[iVar10] = min;
  piVar4[lVar6] = iVar3;
  piVar2[iVar3] = (int)lVar6;
  s->difflev[s->lev] = s->ndiffs;
  s->undifflev[s->lev] = s->nundiffs;
  s->lev = s->lev + 1;
  (*s->split)(s,c,target,(int)lVar6);
  s->adj = s->depAdj;
  s->edg = s->depEdg;
  iVar3 = refine(s,c);
  iVar10 = 0;
  if (((iVar3 != 0) &&
      ((s->fBooleanMatching == 0 || (iVar3 = check_OPP_for_Boolean_matching(s,c), iVar3 != 0)))) &&
     ((s->fBooleanMatching == 0 || (iVar3 = check_OPP_for_Boolean_matching(s,c), iVar3 != 0)))) {
    if ((s->fLookForSwaps != 0) && (&s->left != c)) {
      p = (Vec_Int_t *)malloc(0x10);
      p->nCap = 0x10;
      p->nSize = 0;
      piVar4 = (int *)malloc(0x40);
      p->pArray = piVar4;
      p_00 = (Vec_Int_t *)malloc(0x10);
      p_00->nCap = 0x10;
      p_00->nSize = 0;
      piVar4 = (int *)malloc(0x40);
      p_00->pArray = piVar4;
      if (0 < s->n) {
        iVar3 = 0;
        do {
          lVar6 = (long)iVar3;
          if (-1 < (s->left).clen[lVar6]) {
            lVar7 = lVar6 + -1;
            do {
              Vec_IntPush(p,(s->left).cfront[(s->right).lab[lVar7 + 1]]);
              Vec_IntPush(p_00,(s->right).cfront[(s->left).lab[lVar7 + 1]]);
              lVar7 = lVar7 + 1;
            } while (lVar7 < (s->left).clen[lVar6] + lVar6);
          }
          piVar4 = p->pArray;
          __nmemb = (size_t)p->nSize;
          qsort(piVar4,__nmemb,4,Vec_IntSortCompareUnsigned);
          piVar2 = p_00->pArray;
          uVar8 = p_00->nSize;
          qsort(piVar2,(long)(int)uVar8,4,Vec_IntSortCompareUnsigned);
          if (0 < (long)__nmemb) {
            if ((int)uVar8 < 1) {
              uVar8 = 0;
            }
            sVar5 = 0;
            do {
              if (uVar8 == sVar5) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              if (piVar4[sVar5] != piVar2[sVar5]) {
                if (piVar4 != (int *)0x0) {
                  free(piVar4);
                  p->pArray = (int *)0x0;
                }
                free(p);
                if (piVar2 != (int *)0x0) {
                  free(piVar2);
                  p_00->pArray = (int *)0x0;
                }
                free(p_00);
                return 0;
              }
              sVar5 = sVar5 + 1;
            } while (__nmemb != sVar5);
          }
          p->nSize = 0;
          p_00->nSize = 0;
          iVar3 = (s->left).clen[lVar6] + iVar3 + 1;
        } while (iVar3 < s->n);
      }
      if (p->pArray != (int *)0x0) {
        free(p->pArray);
        p->pArray = (int *)0x0;
      }
      free(p);
      if (p_00->pArray != (int *)0x0) {
        free(p_00->pArray);
        p_00->pArray = (int *)0x0;
      }
      free(p_00);
    }
    if (&s->left != c) {
      lVar6 = (long)s->nsplits;
      while (lVar6 = lVar6 + -1, s->splitlev[(long)s->lev + -1] < lVar6) {
        piVar4 = s->adj;
        lVar9 = (long)c->lab[s->splitwho[lVar6]];
        lVar7 = (long)piVar4[lVar9];
        iVar3 = 0;
        iVar10 = 0;
        uVar8 = 0;
        if (piVar4[lVar9] < piVar4[lVar9 + 1]) {
          uVar8 = 0;
          iVar10 = 0;
          do {
            iVar10 = iVar10 + c->cfront[s->edg[lVar7]];
            uVar8 = uVar8 ^ c->cfront[s->edg[lVar7]];
            lVar7 = lVar7 + 1;
          } while (piVar4[lVar9 + 1] != lVar7);
        }
        piVar2 = (s->left).lab;
        lVar9 = (long)piVar2[s->splitwho[lVar6]];
        lVar7 = (long)piVar4[lVar9];
        uVar11 = 0;
        if (piVar4[lVar9] < piVar4[lVar9 + 1]) {
          uVar11 = 0;
          iVar3 = 0;
          do {
            uVar1 = (s->left).cfront[s->edg[lVar7]];
            iVar3 = iVar3 + uVar1;
            uVar11 = uVar11 ^ uVar1;
            lVar7 = lVar7 + 1;
          } while (piVar4[lVar9 + 1] != lVar7);
        }
        if (iVar10 != iVar3) {
          return 0;
        }
        if (uVar8 != uVar11) {
          return 0;
        }
        lVar7 = (long)c->lab[s->splitfrom[lVar6]];
        lVar9 = (long)piVar4[lVar7];
        iVar3 = 0;
        iVar10 = 0;
        uVar8 = 0;
        if (piVar4[lVar7] < piVar4[lVar7 + 1]) {
          uVar8 = 0;
          iVar10 = 0;
          do {
            iVar10 = iVar10 + c->cfront[s->edg[lVar9]];
            uVar8 = uVar8 ^ c->cfront[s->edg[lVar9]];
            lVar9 = lVar9 + 1;
          } while (piVar4[lVar7 + 1] != lVar9);
        }
        lVar7 = (long)piVar2[s->splitfrom[lVar6]];
        lVar9 = (long)piVar4[lVar7];
        uVar11 = 0;
        if (piVar4[lVar7] < piVar4[lVar7 + 1]) {
          uVar11 = 0;
          iVar3 = 0;
          do {
            uVar1 = (s->left).cfront[s->edg[lVar9]];
            iVar3 = iVar3 + uVar1;
            uVar11 = uVar11 ^ uVar1;
            lVar9 = lVar9 + 1;
          } while (piVar4[lVar7 + 1] != lVar9);
        }
        if (iVar10 != iVar3) {
          return 0;
        }
        if (uVar8 != uVar11) {
          return 0;
        }
      }
    }
    iVar10 = 1;
  }
  return iVar10;
}

Assistant:

static int
descend(struct saucy *s, struct coloring *c, int target, int min)
{
    int back = target + c->clen[target];

    /* Count this node */
    ++s->stats->nodes;

    /* Move the minimum label to the back */
    swap_labels(c, min, back);

    /* Split the cell */
    s->difflev[s->lev] = s->ndiffs;
    s->undifflev[s->lev] = s->nundiffs;
    ++s->lev;
    s->split(s, c, target, back);   

    /* Now go and do some work */
    //print_partition(&s->left, NULL, s->n, s->pNtk, 1);    
    if (!refineByDepGraph(s, c)) return 0;

    /* if we are looking for a Boolean matching, check the OPP and 
     * backtrack if the OPP maps part of one network to itself */
    if (s->fBooleanMatching && !check_OPP_for_Boolean_matching(s, c)) return 0;

    //print_partition(&s->left, NULL, s->n, s->pNtk, 1);
    if (REFINE_BY_SIM_1 && !s->refineBySim1(s, c)) return 0;

    //print_partition(&s->left, NULL, s->n, s->pNtk, 1);
    if (REFINE_BY_SIM_2 && !s->refineBySim2(s, c)) return 0;

    /* do the check once more, maybe the check fails, now that refinement is complete */
    if (s->fBooleanMatching && !check_OPP_for_Boolean_matching(s, c)) return 0;

    if (s->fLookForSwaps && !check_OPP_only_has_swaps(s, c)) return 0;

    if (!double_check_OPP_isomorphism(s, c)) return 0;
    
    return 1;
}